

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix)

{
  pointer pTVar1;
  cmGeneratorTarget *target;
  bool bVar2;
  TargetType TVar3;
  cmLocalGenerator *lg;
  string *a;
  cmExportBuildFileGenerator *this_00;
  pointer pTVar4;
  ImportPropertyMap properties;
  string local_b0;
  string importedXcFrameworkLocation;
  string local_70;
  string local_50;
  
  pTVar1 = (this->Exports).
           super__Vector_base<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = this;
  for (pTVar4 = (this->Exports).
                super__Vector_base<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    target = pTVar4->Target;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &properties._M_t._M_impl.super__Rb_tree_header._M_header;
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    TVar3 = GetExportTargetType(this_00,target);
    if (TVar3 != INTERFACE_LIBRARY) {
      SetImportLocationProperty(this_00,config,suffix,target,&properties);
    }
    if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      TVar3 = GetExportTargetType(this_00,target);
      if (TVar3 != INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,target,&properties);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,target,
                   &properties);
      }
      std::__cxx11::string::string
                ((string *)&importedXcFrameworkLocation,(string *)&pTVar4->XcFrameworkLocation);
      if (importedXcFrameworkLocation._M_string_length != 0) {
        cmGeneratorExpression::Preprocess
                  (&local_50,&importedXcFrameworkLocation,BuildInterface,false);
        std::__cxx11::string::operator=((string *)&importedXcFrameworkLocation,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)&local_70,(string *)&importedXcFrameworkLocation);
        lg = cmGeneratorTarget::GetLocalGenerator(pTVar4->Target);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        cmGeneratorExpression::Evaluate
                  (&local_50,&local_70,lg,config,pTVar4->Target,
                   (cmGeneratorExpressionDAGChecker *)0x0,pTVar4->Target,&local_b0);
        std::__cxx11::string::operator=((string *)&importedXcFrameworkLocation,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        if (importedXcFrameworkLocation._M_string_length != 0) {
          bVar2 = cmsys::SystemTools::FileIsFullPath(&importedXcFrameworkLocation);
          if (!bVar2) {
            a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
            local_b0._M_dataplus._M_p._0_1_ = 0x2f;
            cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                      (&local_50,a,(char *)&local_b0,&importedXcFrameworkLocation);
            std::__cxx11::string::operator=
                      ((string *)&importedXcFrameworkLocation,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                (this,os,config,suffix,target,&properties,&importedXcFrameworkLocation);
      std::__cxx11::string::~string((string *)&importedXcFrameworkLocation);
    }
    this_00 = (cmExportBuildFileGenerator *)&properties;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_00);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  for (auto const& exp : this->Exports) {
    cmGeneratorTarget* target = exp.Target;

    // Collect import properties for this target.
    ImportPropertyMap properties;

    if (this->GetExportTargetType(target) != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (this->GetExportTargetType(target) !=
          cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties);
      }

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      std::string importedXcFrameworkLocation = exp.XcFrameworkLocation;
      if (!importedXcFrameworkLocation.empty()) {
        importedXcFrameworkLocation = cmGeneratorExpression::Preprocess(
          importedXcFrameworkLocation,
          cmGeneratorExpression::PreprocessContext::BuildInterface);
        importedXcFrameworkLocation = cmGeneratorExpression::Evaluate(
          importedXcFrameworkLocation, exp.Target->GetLocalGenerator(), config,
          exp.Target, nullptr, exp.Target);
        if (!importedXcFrameworkLocation.empty() &&
            !cmSystemTools::FileIsFullPath(importedXcFrameworkLocation)) {
          importedXcFrameworkLocation =
            cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/',
                     importedXcFrameworkLocation);
        }
      }
      this->GenerateImportPropertyCode(os, config, suffix, target, properties,
                                       importedXcFrameworkLocation);
    }
  }
}